

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::log_assert(JUnitReporter *this,AssertData *rb)

{
  uint uVar1;
  ostream *s;
  AssertData *rb_00;
  ostream *poVar2;
  string *details;
  long in_RSI;
  char *pcVar3;
  JUnitReporter *in_RDI;
  ostringstream os;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffd88;
  lock_guard<std::mutex> *in_stack_fffffffffffffd90;
  allocator *type;
  ostringstream *in_stack_fffffffffffffd98;
  allocator *message;
  JUnitReporter *in_stack_fffffffffffffda0;
  JUnitTestCaseData *this_00;
  char *local_230;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [48];
  ostringstream local_190 [384];
  long local_10;
  
  if ((*(byte *)(in_RSI + 0x28) & 1) != 0) {
    local_10 = in_RSI;
    std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    std::__cxx11::ostringstream::ostringstream(local_190);
    s = (ostream *)skipPathFromFilename((char *)in_stack_fffffffffffffd98);
    rb_00 = (AssertData *)std::operator<<((ostream *)local_190,(char *)s);
    if ((in_RDI->opt->gnu_file_line & 1U) == 0) {
      local_230 = "(";
    }
    else {
      local_230 = ":";
    }
    poVar2 = std::operator<<((ostream *)rb_00,local_230);
    uVar1 = line(in_RDI,*(uint *)(local_10 + 0x18));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    pcVar3 = "):";
    if ((in_RDI->opt->gnu_file_line & 1U) != 0) {
      pcVar3 = ":";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    fulltext_log_assert_to_stream(s,rb_00);
    log_contexts(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    this_00 = &in_RDI->testCaseData;
    pcVar3 = String::c_str((String *)0x12f09b);
    message = &local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,pcVar3,message);
    details = (string *)assertString(*(Enum *)(local_10 + 8));
    type = &local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,(char *)details,type);
    std::__cxx11::ostringstream::str();
    JUnitTestCaseData::addFailure(this_00,(string *)message,(string *)type,details);
    std::__cxx11::string::~string(local_210);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12f198);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed) // report only failures & ignore the `success` option
                return;

            std::lock_guard<std::mutex> lock(mutex);

            std::ostringstream os;
            os << skipPathFromFilename(rb.m_file) << (opt.gnu_file_line ? ":" : "(")
              << line(rb.m_line) << (opt.gnu_file_line ? ":" : "):") << std::endl;

            fulltext_log_assert_to_stream(os, rb);
            log_contexts(os);
            testCaseData.addFailure(rb.m_decomp.c_str(), assertString(rb.m_at), os.str());
        }